

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorGradient.cpp
# Opt level: O3

SharedPtr<Decorator> __thiscall
Rml::DecoratorStraightGradientInstancer::InstanceDecorator
          (DecoratorStraightGradientInstancer *this,String *name,PropertyDictionary *properties_,
          DecoratorInstancerInterface *param_3)

{
  Colourb CVar1;
  Colourb CVar2;
  int iVar3;
  Property *pPVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  SharedPtr<Decorator> SVar5;
  Colour<unsigned_char,_255,_false> local_48;
  undefined1 local_41;
  DecoratorStraightGradient *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  iVar3 = ::std::__cxx11::string::compare((char *)properties_);
  if (iVar3 == 0) {
    local_48.red = '\0';
    local_48.green = '\0';
    local_48.blue = '\0';
    local_48.alpha = '\0';
  }
  else {
    iVar3 = ::std::__cxx11::string::compare((char *)properties_);
    if (iVar3 == 0) {
      local_48.red = '\x01';
      local_48.green = '\0';
      local_48.blue = '\0';
      local_48.alpha = '\0';
    }
    else {
      pPVar4 = PropertyDictionary::GetProperty
                         ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[8]);
      local_40 = (DecoratorStraightGradient *)((ulong)local_40 & 0xffffffff00000000);
      Variant::GetInto<int,_0>(&pPVar4->value,(int *)&local_40);
      local_48 = local_40._0_4_;
      Log::Message(LT_WARNING,
                   "Decorator syntax \'gradient(horizontal|vertical ...)\' is deprecated, please replace with \'horizontal-gradient(...)\' or \'vertical-gradient(...)\'"
                  );
    }
  }
  pPVar4 = PropertyDictionary::GetProperty
                     ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[9]);
  local_40._0_1_ = '\0';
  local_40._1_1_ = '\0';
  local_40._2_1_ = '\0';
  local_40._3_1_ = 0xff;
  Variant::GetInto<Rml::Colour<unsigned_char,_255,_false>,_0>
            (&pPVar4->value,(Colour<unsigned_char,_255,_false> *)&local_40);
  CVar1 = local_40._0_4_;
  pPVar4 = PropertyDictionary::GetProperty
                     ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[10]);
  local_40 = (DecoratorStraightGradient *)CONCAT44(local_40._4_4_,0xff000000);
  Variant::GetInto<Rml::Colour<unsigned_char,_255,_false>,_0>
            (&pPVar4->value,(Colour<unsigned_char,_255,_false> *)&local_40);
  CVar2 = local_40._0_4_;
  local_40 = (DecoratorStraightGradient *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Rml::DecoratorStraightGradient,std::allocator<Rml::DecoratorStraightGradient>>
            (&local_38,&local_40,(allocator<Rml::DecoratorStraightGradient> *)&local_41);
  local_40->direction = (Direction)local_48;
  local_40->start = CVar1;
  local_40->stop = CVar2;
  (this->super_DecoratorInstancer)._vptr_DecoratorInstancer = (_func_int **)local_40;
  (this->super_DecoratorInstancer).super_EffectSpecification.properties.properties.
  super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_38._M_pi;
  SVar5.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  SVar5.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (SharedPtr<Decorator>)SVar5.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedPtr<Decorator> DecoratorStraightGradientInstancer::InstanceDecorator(const String& name, const PropertyDictionary& properties_,
	const DecoratorInstancerInterface& /*interface_*/)
{
	using Direction = DecoratorStraightGradient::Direction;
	Direction direction;
	if (name == "horizontal-gradient")
		direction = Direction::Horizontal;
	else if (name == "vertical-gradient")
		direction = Direction::Vertical;
	else
	{
		direction = (Direction)properties_.GetProperty(ids.direction)->Get<int>();
		Log::Message(Log::LT_WARNING,
			"Decorator syntax 'gradient(horizontal|vertical ...)' is deprecated, please replace with 'horizontal-gradient(...)' or "
			"'vertical-gradient(...)'");
	}

	Colourb start = properties_.GetProperty(ids.start)->Get<Colourb>();
	Colourb stop = properties_.GetProperty(ids.stop)->Get<Colourb>();

	auto decorator = MakeShared<DecoratorStraightGradient>();
	if (decorator->Initialise(direction, start, stop))
		return decorator;

	return nullptr;
}